

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalStorage::DropColumn
          (LocalStorage *this,DataTable *old_dt,DataTable *new_dt,idx_t drop_column_index)

{
  type args_2;
  shared_ptr<duckdb::LocalTableStorage,_true> storage;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  undefined1 local_60 [24];
  shared_ptr<duckdb::LocalTableStorage,_true> local_48;
  element_type *local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  local_60._16_8_ = drop_column_index;
  LocalTableManager::MoveEntry((LocalTableManager *)local_60,(DataTable *)&this->table_manager);
  if (local_60._0_8_ != 0) {
    args_2 = shared_ptr<duckdb::LocalTableStorage,_true>::operator*
                       ((shared_ptr<duckdb::LocalTableStorage,_true> *)local_60);
    make_shared_ptr<duckdb::LocalTableStorage,duckdb::DataTable&,duckdb::LocalTableStorage&,unsigned_long_const&>
              ((DataTable *)&stack0xffffffffffffffc8,(LocalTableStorage *)new_dt,
               (unsigned_long *)args_2);
    local_48.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_38;
    local_48.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_30._M_pi;
    local_38 = (element_type *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LocalTableManager::InsertEntry(&this->table_manager,new_dt,&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.internal.
                super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  return;
}

Assistant:

void LocalStorage::DropColumn(DataTable &old_dt, DataTable &new_dt, const idx_t drop_column_index) {
	// check if there are any pending appends for the old version of the table
	auto storage = table_manager.MoveEntry(old_dt);
	if (!storage) {
		return;
	}
	auto new_storage = make_shared_ptr<LocalTableStorage>(new_dt, *storage, drop_column_index);
	table_manager.InsertEntry(new_dt, std::move(new_storage));
}